

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O2

wchar_t reconfigure_for_term_if_necessary(_Bool update_names,player *p,equippable_summary *s)

{
  undefined8 *puVar1;
  wchar_t wVar2;
  equippable *peVar3;
  wchar_t wVar4;
  char *__s;
  size_t sVar5;
  int iVar6;
  wchar_t wVar7;
  long lVar8;
  wchar_t wVar9;
  long lVar10;
  wchar_t nrow;
  wchar_t ncol;
  player *local_38;
  
  local_38 = p;
  Term_get_size(&ncol,&nrow);
  if ((s->term_ncol != ncol) || (wVar4 = L'\0', s->term_nrow != nrow)) {
    iVar6 = nrow - s->irow_combined_equip;
    wVar9 = iVar6 + L'\xfffffffe';
    s->maxpage = wVar9;
    if (iVar6 < 3) {
      wVar4 = L'\x01';
    }
    else {
      wVar4 = L'\0';
      if (wVar9 < s->npage) {
        s->npage = wVar9;
        if (s->work_sel != L'\xffffffff') {
          wVar4 = L'\0';
          if (wVar9 <= (s->work_sel - s->ifirst) * s->indinc) {
            s->work_sel = s->indinc * (iVar6 + -3) + s->ifirst;
          }
        }
      }
    }
    wVar9 = s->propcats[4].n;
    wVar7 = ~s->icol_name + (ncol - s->nprop) + wVar9;
    if (wVar7 < L'\x10') {
      wVar7 = wVar7 + s->propcats[3].n;
      if (wVar7 < L'\x10') {
        wVar7 = wVar7 + s->propcats[2].n;
        s->nview = L'\x03';
        wVar2 = s->propcats[1].n;
        s->propcats[0].nvw[0] = s->propcats[0].n;
        s->propcats[0].nvw[1] = L'\0';
        s->propcats[0].nvw[2] = L'\0';
        s->propcats[0].ivw[0] = L'\0';
        s->propcats[0].ivw[1] = L'\0';
        s->propcats[0].ivw[2] = L'\0';
        s->propcats[1].nvw[0] = wVar2;
        s->propcats[1].ivw[2] = L'\0';
        s->propcats[1].nvw[1] = L'\0';
        s->propcats[1].nvw[2] = L'\0';
        s->propcats[1].ivw[0] = L'\0';
        s->propcats[1].ivw[1] = L'\0';
        for (lVar8 = 0; lVar8 != 0x70; lVar8 = lVar8 + 0x38) {
          *(undefined4 *)((long)s->propcats[2].nvw + lVar8) = 0;
          *(undefined4 *)((long)s->propcats[2].nvw + lVar8 + 4) =
               *(undefined4 *)((long)s->propcats[2].nvw + lVar8 + -8);
          puVar1 = (undefined8 *)((long)s->propcats[2].nvw + lVar8 + 8);
          *puVar1 = 0;
          puVar1[1] = 0;
        }
        if (wVar7 < L'\x10') {
          wVar4 = L'\x01';
        }
        s->propcats[4].nvw[0] = L'\0';
        s->propcats[4].nvw[1] = L'\0';
        s->propcats[4].nvw[2] = wVar9;
        s->propcats[4].ivw[0] = L'\0';
        s->propcats[4].ivw[1] = L'\0';
        s->propcats[4].ivw[2] = L'\0';
      }
      else {
        s->nview = L'\x02';
        for (lVar8 = 0x4c; lVar8 != 0xf4; lVar8 = lVar8 + 0x38) {
          *(undefined4 *)((long)s->propcats[0].nvw + lVar8 + -0x4c) =
               *(undefined4 *)((long)s->propcats[0].nvw + lVar8 + -0x54);
          puVar1 = (undefined8 *)((long)s->propcats[0].nvw + lVar8 + -0x48);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)s->propcats[0].nvw + lVar8 + -0x38) = 0;
        }
        for (lVar8 = 0; lVar8 != 0x70; lVar8 = lVar8 + 0x38) {
          *(undefined4 *)((long)s->propcats[3].nvw + lVar8) = 0;
          *(undefined4 *)((long)s->propcats[3].nvw + lVar8 + 4) =
               *(undefined4 *)((long)s->propcats[3].nvw + lVar8 + -8);
          puVar1 = (undefined8 *)((long)s->propcats[3].nvw + lVar8 + 8);
          *puVar1 = 0;
          puVar1[1] = 0;
        }
      }
    }
    else {
      s->nview = L'\x02';
      for (lVar8 = 0; lVar8 != 0xe0; lVar8 = lVar8 + 0x38) {
        *(undefined4 *)((long)s->propcats[0].nvw + lVar8) =
             *(undefined4 *)((long)s->propcats[0].nvw + lVar8 + -8);
        puVar1 = (undefined8 *)((long)s->propcats[0].nvw + lVar8 + 4);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)s->propcats[0].ivw + lVar8 + 8) = 0;
      }
      s->propcats[4].nvw[0] = L'\0';
      s->propcats[4].nvw[1] = wVar9;
      *(undefined8 *)(s->propcats[4].nvw + 2) = 0;
      s->propcats[4].ivw[1] = L'\0';
      s->propcats[4].ivw[2] = L'\0';
    }
    if (s->nview <= s->iview) {
      s->iview = s->nview + L'\xffffffff';
    }
    wVar9 = L'\x14';
    if (wVar7 < L'\x14') {
      wVar9 = wVar7;
    }
    if (update_names && wVar9 != s->nshortnm) {
      lVar10 = 0;
      for (lVar8 = 0; lVar8 < s->nitems; lVar8 = lVar8 + 1) {
        string_free(*(char **)((long)&s->items->short_name + lVar10));
        __s = set_short_name(*(object **)((long)&s->items->obj + lVar10),(long)wVar9,local_38);
        peVar3 = s->items;
        *(char **)((long)&peVar3->short_name + lVar10) = __s;
        sVar5 = strlen(__s);
        *(int *)((long)&peVar3->nmlen + lVar10) = (int)sVar5;
        lVar10 = lVar10 + 0x38;
      }
    }
    s->nshortnm = wVar9;
    s->term_ncol = ncol;
    s->term_nrow = nrow;
  }
  return wVar4;
}

Assistant:

static int reconfigure_for_term_if_necessary(bool update_names,
	const struct player *p, struct equippable_summary *s)
{
	int result = 0;
	int min_length = 16;
	int ncol, nrow, length, i;

	Term_get_size(&ncol, &nrow);
	if (s->term_ncol == ncol && s->term_nrow == nrow) {
		return result;
	}

	/*
	 * Have s->irow_combined_equip + 1 rows of a header and one row, for
	 * prompts, of a footer.
	 */
	s->maxpage = nrow - s->irow_combined_equip - 2;
	if (s->maxpage < 1) {
		result = 1;
	} else if (s->npage > s->maxpage) {
		s->npage = s->maxpage;
		if (s->work_sel != -1 &&
			(s->work_sel - s->ifirst) * s->indinc >= s->npage) {
			s->work_sel = s->ifirst + (s->npage - 1) * s->indinc;
		}
	}

	/*
	 * Leave a space between the name and the properties.  Don't include
	 * the core stat modifiers in the first view.
	 */
	length = ncol - s->nprop + s->propcats[N_ELEMENTS(s->propcats) - 1].n -
		1 - s->icol_name;
	if (length < min_length) {
		/* Try shifting the other modifiers to the second view. */
		length += s->propcats[N_ELEMENTS(s->propcats) - 2].n;
		if (length < min_length) {
			/* Try a three view layout. */
			length += s->propcats[N_ELEMENTS(s->propcats) - 3].n;
			if (length < min_length) {
				/* Give up. */
				result = 1;
			}
			s->nview = 3;
			for (i = 0; i < (int)N_ELEMENTS(s->propcats) - 3; ++i) {
				s->propcats[i].nvw[0] = s->propcats[i].n;
				s->propcats[i].nvw[1] = 0;
				s->propcats[i].nvw[2] = 0;
				s->propcats[i].ivw[0] = 0;
				s->propcats[i].ivw[1] = 0;
				s->propcats[i].ivw[2] = 0;
			}
			for (i = (int)N_ELEMENTS(s->propcats) - 3;
				i < (int)N_ELEMENTS(s->propcats) - 1; ++i) {
				s->propcats[i].nvw[0] = 0;
				s->propcats[i].nvw[1] = s->propcats[i].n;
				s->propcats[i].nvw[2] = 0;
				s->propcats[i].ivw[0] = 0;
				s->propcats[i].ivw[1] = 0;
				s->propcats[i].ivw[2] = 0;
			}
			s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[0] = 0;
			s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[1] = 0;
			s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[2] =
				s->propcats[N_ELEMENTS(s->propcats) - 1].n;
			s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[0] = 0;
			s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[1] = 0;
			s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[2] = 0;
		} else {
			s->nview = 2;
			for (i = 0; i < (int)N_ELEMENTS(s->propcats) - 2; ++i) {
				s->propcats[i].nvw[0] = s->propcats[i].n;
				s->propcats[i].nvw[1] = 0;
				s->propcats[i].nvw[2] = 0;
				s->propcats[i].ivw[0] = 0;
				s->propcats[i].ivw[1] = 0;
				s->propcats[i].ivw[2] = 0;
			}
			for (i = (int)N_ELEMENTS(s->propcats) - 2;
				i < (int)N_ELEMENTS(s->propcats); ++i) {
				s->propcats[i].nvw[0] = 0;
				s->propcats[i].nvw[1] = s->propcats[i].n;
				s->propcats[i].nvw[2] = 0;
				s->propcats[i].ivw[0] = 0;
				s->propcats[i].ivw[1] = 0;
				s->propcats[i].ivw[2] = 0;
			}
		}
	} else {
		s->nview = 2;
		for (i = 0; i < (int)N_ELEMENTS(s->propcats) - 1; ++i) {
			s->propcats[i].nvw[0] = s->propcats[i].n;
			s->propcats[i].nvw[1] = 0;
			s->propcats[i].nvw[2] = 0;
			s->propcats[i].ivw[0] = 0;
			s->propcats[i].ivw[1] = 0;
			s->propcats[i].ivw[2] = 0;
		}
		s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[0] = 0;
		s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[1] =
			s->propcats[N_ELEMENTS(s->propcats) - 1].n;
		s->propcats[N_ELEMENTS(s->propcats) - 1].nvw[2] = 0;
		s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[0] = 0;
		s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[1] = 0;
		s->propcats[N_ELEMENTS(s->propcats) - 1].ivw[2] = 0;
	}
	if (s->iview >= s->nview) {
		s->iview = s->nview - 1;
	}
	if (length > 20) {
		length = 20;
	}
	if (length != s->nshortnm && update_names) {
		for (i = 0; i < s->nitems; ++i) {
			string_free(s->items[i].short_name);
			s->items[i].short_name =
				set_short_name(s->items[i].obj, length, p);
			s->items[i].nmlen =
				(int)strlen(s->items[i].short_name);
		}
	}
	s->nshortnm = length;

	s->term_ncol = ncol;
	s->term_nrow = nrow;

	return result;
}